

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O0

void decode_alGetBooleanv(void)

{
  ALboolean AVar1;
  ALenum param_00;
  uint32 numvals_00;
  ALboolean *origvalues_00;
  ALboolean *local_260;
  uint local_254;
  ALsizei i;
  ALboolean *values;
  uint32 numvals;
  ALboolean *origvalues;
  undefined1 local_230 [4];
  ALenum param;
  CallerInfo callerinfo;
  
  IO_ENTRYINFO((CallerInfo *)local_230);
  if (io_failure == 0) {
    param_00 = IO_ENUM();
    origvalues_00 = (ALboolean *)IO_PTR();
    numvals_00 = IO_UINT32();
    if (numvals_00 == 0) {
      local_260 = (ALboolean *)0x0;
    }
    else {
      local_260 = (ALboolean *)get_ioblob((ulong)numvals_00);
    }
    for (local_254 = 0; local_254 < numvals_00; local_254 = local_254 + 1) {
      AVar1 = IO_BOOLEAN();
      local_260[(int)local_254] = AVar1;
    }
    if (io_failure == 0) {
      visit_alGetBooleanv((CallerInfo *)local_230,param_00,origvalues_00,numvals_00,local_260);
    }
  }
  return;
}

Assistant:

static void decode_alGetBooleanv(void)
{
    IO_START(alGetBooleanv);
    const ALenum param = IO_ENUM();
    ALboolean *origvalues = (ALboolean *) IO_PTR();
    const uint32 numvals = IO_UINT32();
    ALboolean *values = (ALboolean *) (numvals ? get_ioblob(numvals * sizeof (ALboolean)) : NULL);
    ALsizei i;

    for (i = 0; i < numvals; i++) {
        values[i] = IO_BOOLEAN();
    }

    if (!io_failure) visit_alGetBooleanv(&callerinfo, param, origvalues, numvals, values);

    IO_END();
}